

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.h
# Opt level: O0

cmCommand * __thiscall cmTargetCompileFeaturesCommand::Clone(cmTargetCompileFeaturesCommand *this)

{
  cmCommand *this_00;
  cmTargetCompileFeaturesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x78);
  cmTargetCompileFeaturesCommand((cmTargetCompileFeaturesCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmTargetCompileFeaturesCommand;
    }